

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O2

bool qWidgetShortcutContextMatcher(QObject *object,ShortcutContext context)

{
  Data *pDVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  QWidget *active_window;
  QWidget *pQVar5;
  QObject *pQVar6;
  QWidgetWindow *pQVar7;
  QAction *a;
  QGraphicsWidget *w;
  QShortcut *pQVar8;
  
  active_window = QApplication::activeWindow();
  pQVar5 = QApplication::activePopupWidget();
  if (pQVar5 != (QWidget *)0x0) {
    active_window = QApplication::activePopupWidget();
  }
  if (active_window == (QWidget *)0x0) {
    pQVar6 = (QObject *)QGuiApplication::focusWindow();
    if ((pQVar6 == (QObject *)0x0) || (cVar2 = QWindow::isActive(), cVar2 == '\0')) {
LAB_0037f1b3:
      active_window = (QWidget *)0x0;
    }
    else {
      active_window = (QWidget *)0x0;
      do {
        pQVar7 = QtPrivate::qobject_cast_helper<QWidgetWindow*,QObject>(pQVar6);
        if (pQVar7 != (QWidgetWindow *)0x0) {
          pDVar1 = (pQVar7->m_widget).wp.d;
          if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) goto LAB_0037f1b3;
          active_window = (QWidget *)(pQVar7->m_widget).wp.value;
          break;
        }
        pQVar6 = (QObject *)QWindow::parent(pQVar6,0);
      } while (pQVar6 != (QObject *)0x0);
    }
  }
  a = QtPrivate::qobject_cast_helper<QAction*,QObject>(object);
  if (a != (QAction *)0x0) {
    bVar3 = correctActionContext(context,a,active_window);
    return bVar3;
  }
  w = QtPrivate::qobject_cast_helper<QGraphicsWidget*,QObject>(object);
  if (w != (QGraphicsWidget *)0x0) {
    bVar3 = correctGraphicsWidgetContext(context,w,active_window);
    return bVar3;
  }
  if (((object != (QObject *)0x0) &&
      (pQVar5 = (QWidget *)object, (*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0)) ||
     ((pQVar8 = QtPrivate::qobject_cast_helper<QShortcut*,QObject>(object),
      pQVar8 != (QShortcut *)0x0 &&
      ((pQVar5 = *(QWidget **)(*(long *)(pQVar8 + 8) + 0x10), pQVar5 != (QWidget *)0x0 &&
       ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0)))))) {
LAB_0037f24c:
    bVar3 = correctWidgetContext(context,pQVar5,active_window);
    return bVar3;
  }
  if (object == (QObject *)0x0) {
    pQVar6 = (QObject *)0x0;
  }
  else {
    pQVar6 = (QObject *)0x0;
    if ((*(byte *)(*(long *)(object + 8) + 0x30) & 0x40) != 0) {
      pQVar6 = object;
    }
  }
  do {
    if (pQVar6 == (QObject *)0x0) {
LAB_0037f29e:
      uVar4 = QShortcutPrivate::simpleContextMatcher(object,context);
      return (bool)uVar4;
    }
    pQVar7 = QtPrivate::qobject_cast_helper<QWidgetWindow*,QObject>(pQVar6);
    if (pQVar7 != (QWidgetWindow *)0x0) {
      pDVar1 = (pQVar7->m_widget).wp.d;
      if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
         (pQVar5 = (QWidget *)(pQVar7->m_widget).wp.value, pQVar5 != (QWidget *)0x0))
      goto LAB_0037f24c;
      goto LAB_0037f29e;
    }
    pQVar6 = (QObject *)QWindow::parent(pQVar6,0);
  } while( true );
}

Assistant:

bool qWidgetShortcutContextMatcher(QObject *object, Qt::ShortcutContext context)
{
    Q_ASSERT_X(object, "QShortcutMap", "Shortcut has no owner. Illegal map state!");

    QWidget *active_window = QApplication::activeWindow();

    // popups do not become the active window,
    // so we fake it here to get the correct context
    // for the shortcut system.
    if (QApplication::activePopupWidget())
        active_window = QApplication::activePopupWidget();

    if (!active_window) {
        QWindow *qwindow = QGuiApplication::focusWindow();
        if (qwindow && qwindow->isActive()) {
            while (qwindow) {
                if (auto widgetWindow = qobject_cast<QWidgetWindow *>(qwindow)) {
                    active_window = widgetWindow->widget();
                    break;
                }
                qwindow = qwindow->parent();
            }
        }
    }

#if QT_CONFIG(action)
    if (auto a = qobject_cast<QAction *>(object))
        return correctActionContext(context, a, active_window);
#endif

#if QT_CONFIG(graphicsview)
    if (auto gw = qobject_cast<QGraphicsWidget *>(object))
        return correctGraphicsWidgetContext(context, gw, active_window);
#endif

    auto w = qobject_cast<QWidget *>(object);
    if (!w) {
        if (auto s = qobject_cast<QShortcut *>(object))
            w = qobject_cast<QWidget *>(s->parent());
    }

    if (!w) {
        auto qwindow = qobject_cast<QWindow *>(object);
        while (qwindow) {
            if (auto widget_window = qobject_cast<QWidgetWindow *>(qwindow)) {
                w = widget_window->widget();
                break;
            }
            qwindow = qwindow->parent();
        }
    }

    if (w)
        return correctWidgetContext(context, w, active_window);

    return QShortcutPrivate::simpleContextMatcher(object, context);
}